

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleStringsCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  BOM BVar7;
  uint uVar8;
  size_type sVar9;
  const_reference pvVar10;
  char *pcVar11;
  undefined8 uVar12;
  ostream *poVar13;
  char *outFileName;
  streamoff sVar14;
  long lVar15;
  ulong uVar16;
  reference pbVar17;
  bool local_1455;
  uint local_133c;
  uint i_2;
  string *sr;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1328;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1320;
  const_iterator si;
  string output;
  char *sep;
  uint local_12e8;
  uint j_2;
  uint j_1;
  uint j;
  uint num_utf8_bytes;
  int c1;
  uint i_1;
  int c;
  string current_str;
  undefined1 local_12a0 [8];
  string s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  uint local_1260;
  int output_size;
  uint bytes_rem;
  int bom_found;
  undefined1 local_1238 [8];
  ostringstream e_8;
  long local_10c0;
  ifstream fin;
  allocator local_eb1;
  string local_eb0 [8];
  string binaryFileName;
  undefined1 local_e70 [8];
  ostringstream e_7;
  string local_cf8;
  undefined1 local_cd8 [8];
  ostringstream e_6;
  string local_b60;
  undefined1 local_b40 [8];
  ostringstream e_5;
  string local_9c8;
  undefined1 local_9a8 [8];
  ostringstream e_4;
  int local_82c;
  undefined1 local_828 [4];
  int len_1;
  undefined1 local_808 [8];
  ostringstream e_3;
  int local_68c;
  undefined1 local_688 [4];
  int len;
  undefined1 local_668 [8];
  ostringstream e_2;
  uint local_4ec;
  undefined1 local_4e8 [4];
  int count;
  undefined1 local_4c8 [8];
  ostringstream e_1;
  int local_34c;
  string local_348;
  undefined1 local_328 [8];
  ostringstream e;
  uint local_1b0;
  int local_1ac;
  uint i;
  int arg_mode;
  int encoding;
  bool hex_conversion_enabled;
  bool newline_consume;
  bool have_regex;
  RegularExpression regex;
  int local_c8;
  uint limit_count;
  int limit_output;
  int limit_input;
  uint maxlen;
  uint minlen;
  string outVar;
  string local_78 [8];
  string fileName;
  allocator local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar9 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar9 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"STRINGS requires a file name and output variable",&local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    this_local._7_1_ = 0;
    goto LAB_005c46d2;
  }
  pvVar10 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](local_20,1);
  std::__cxx11::string::string(local_78,(string *)pvVar10);
  pcVar11 = (char *)std::__cxx11::string::c_str();
  bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar11);
  if (!bVar2) {
    pcVar11 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    std::__cxx11::string::operator=(local_78,pcVar11);
    pvVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](local_20,1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&outVar.field_2 + 8),"/",pvVar10);
    std::__cxx11::string::operator+=(local_78,(string *)(outVar.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(outVar.field_2._M_local_buf + 8));
  }
  pvVar10 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](local_20,2);
  std::__cxx11::string::string((string *)&maxlen,(string *)pvVar10);
  limit_input = 0;
  limit_output = 0;
  limit_count = 0xffffffff;
  local_c8 = -1;
  regex.searchstring._4_4_ = 0;
  cmsys::RegularExpression::RegularExpression((RegularExpression *)&encoding);
  bVar4 = false;
  bVar1 = false;
  bVar2 = true;
  i = 0;
  local_1ac = 0;
  for (local_1b0 = 3;
      sVar9 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_20), local_1b0 < sVar9; local_1b0 = local_1b0 + 1) {
    pvVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](local_20,(ulong)local_1b0);
    bVar3 = std::operator==(pvVar10,"LIMIT_INPUT");
    if (bVar3) {
      local_1ac = 1;
    }
    else {
      pvVar10 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](local_20,(ulong)local_1b0);
      bVar3 = std::operator==(pvVar10,"LIMIT_OUTPUT");
      if (bVar3) {
        local_1ac = 2;
      }
      else {
        pvVar10 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](local_20,(ulong)local_1b0);
        bVar3 = std::operator==(pvVar10,"LIMIT_COUNT");
        if (bVar3) {
          local_1ac = 3;
        }
        else {
          pvVar10 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](local_20,(ulong)local_1b0);
          bVar3 = std::operator==(pvVar10,"LENGTH_MINIMUM");
          if (bVar3) {
            local_1ac = 4;
          }
          else {
            pvVar10 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](local_20,(ulong)local_1b0);
            bVar3 = std::operator==(pvVar10,"LENGTH_MAXIMUM");
            if (bVar3) {
              local_1ac = 5;
            }
            else {
              pvVar10 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[](local_20,(ulong)local_1b0);
              bVar3 = std::operator==(pvVar10,"REGEX");
              if (bVar3) {
                local_1ac = 7;
              }
              else {
                pvVar10 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[](local_20,(ulong)local_1b0);
                bVar3 = std::operator==(pvVar10,"NEWLINE_CONSUME");
                if (bVar3) {
                  bVar1 = true;
                  local_1ac = 0;
                }
                else {
                  pvVar10 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[](local_20,(ulong)local_1b0);
                  bVar3 = std::operator==(pvVar10,"NO_HEX_CONVERSION");
                  if (bVar3) {
                    bVar2 = false;
                    local_1ac = 0;
                  }
                  else {
                    pvVar10 = std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator[](local_20,(ulong)local_1b0);
                    bVar3 = std::operator==(pvVar10,"ENCODING");
                    if (bVar3) {
                      local_1ac = 8;
                    }
                    else {
                      if (local_1ac == 1) {
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[](local_20,(ulong)local_1b0);
                        uVar12 = std::__cxx11::string::c_str();
                        iVar6 = __isoc99_sscanf(uVar12,"%d",&limit_count);
                        if ((iVar6 != 1) || ((int)limit_count < 0)) {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
                          poVar13 = std::operator<<((ostream *)local_328,
                                                    "STRINGS option LIMIT_INPUT value \"");
                          pvVar10 = std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::operator[](local_20,(ulong)local_1b0);
                          poVar13 = std::operator<<(poVar13,(string *)pvVar10);
                          std::operator<<(poVar13,"\" is not an unsigned integer.");
                          std::__cxx11::ostringstream::str();
                          cmCommand::SetError(&this->super_cmCommand,&local_348);
                          std::__cxx11::string::~string((string *)&local_348);
                          this_local._7_1_ = 0;
                          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
                          goto LAB_005c468c;
                        }
                      }
                      else if (local_1ac == 2) {
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[](local_20,(ulong)local_1b0);
                        uVar12 = std::__cxx11::string::c_str();
                        iVar6 = __isoc99_sscanf(uVar12,"%d",&local_c8);
                        if ((iVar6 != 1) || (local_c8 < 0)) {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
                          poVar13 = std::operator<<((ostream *)local_4c8,
                                                    "STRINGS option LIMIT_OUTPUT value \"");
                          pvVar10 = std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::operator[](local_20,(ulong)local_1b0);
                          poVar13 = std::operator<<(poVar13,(string *)pvVar10);
                          std::operator<<(poVar13,"\" is not an unsigned integer.");
                          std::__cxx11::ostringstream::str();
                          cmCommand::SetError(&this->super_cmCommand,(string *)local_4e8);
                          std::__cxx11::string::~string((string *)local_4e8);
                          this_local._7_1_ = 0;
                          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
                          goto LAB_005c468c;
                        }
                      }
                      else if (local_1ac == 3) {
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[](local_20,(ulong)local_1b0);
                        uVar12 = std::__cxx11::string::c_str();
                        iVar6 = __isoc99_sscanf(uVar12,"%d",&local_4ec);
                        if ((iVar6 != 1) || ((int)local_4ec < 0)) {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_668);
                          poVar13 = std::operator<<((ostream *)local_668,
                                                    "STRINGS option LIMIT_COUNT value \"");
                          pvVar10 = std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::operator[](local_20,(ulong)local_1b0);
                          poVar13 = std::operator<<(poVar13,(string *)pvVar10);
                          std::operator<<(poVar13,"\" is not an unsigned integer.");
                          std::__cxx11::ostringstream::str();
                          cmCommand::SetError(&this->super_cmCommand,(string *)local_688);
                          std::__cxx11::string::~string((string *)local_688);
                          this_local._7_1_ = 0;
                          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_668);
                          goto LAB_005c468c;
                        }
                        regex.searchstring._4_4_ = local_4ec;
                      }
                      else if (local_1ac == 4) {
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[](local_20,(ulong)local_1b0);
                        uVar12 = std::__cxx11::string::c_str();
                        iVar6 = __isoc99_sscanf(uVar12,"%d",&local_68c);
                        if ((iVar6 != 1) || (local_68c < 0)) {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_808);
                          poVar13 = std::operator<<((ostream *)local_808,
                                                    "STRINGS option LENGTH_MINIMUM value \"");
                          pvVar10 = std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::operator[](local_20,(ulong)local_1b0);
                          poVar13 = std::operator<<(poVar13,(string *)pvVar10);
                          std::operator<<(poVar13,"\" is not an unsigned integer.");
                          std::__cxx11::ostringstream::str();
                          cmCommand::SetError(&this->super_cmCommand,(string *)local_828);
                          std::__cxx11::string::~string((string *)local_828);
                          this_local._7_1_ = 0;
                          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_808);
                          goto LAB_005c468c;
                        }
                        limit_input = local_68c;
                      }
                      else if (local_1ac == 5) {
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[](local_20,(ulong)local_1b0);
                        uVar12 = std::__cxx11::string::c_str();
                        iVar6 = __isoc99_sscanf(uVar12,"%d",&local_82c);
                        if ((iVar6 != 1) || (local_82c < 0)) {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_9a8);
                          poVar13 = std::operator<<((ostream *)local_9a8,
                                                    "STRINGS option LENGTH_MAXIMUM value \"");
                          pvVar10 = std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::operator[](local_20,(ulong)local_1b0);
                          poVar13 = std::operator<<(poVar13,(string *)pvVar10);
                          std::operator<<(poVar13,"\" is not an unsigned integer.");
                          std::__cxx11::ostringstream::str();
                          cmCommand::SetError(&this->super_cmCommand,&local_9c8);
                          std::__cxx11::string::~string((string *)&local_9c8);
                          this_local._7_1_ = 0;
                          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_9a8);
                          goto LAB_005c468c;
                        }
                        limit_output = local_82c;
                      }
                      else if (local_1ac == 7) {
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[](local_20,(ulong)local_1b0);
                        pcVar11 = (char *)std::__cxx11::string::c_str();
                        bVar4 = cmsys::RegularExpression::compile
                                          ((RegularExpression *)&encoding,pcVar11);
                        if (!bVar4) {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b40);
                          poVar13 = std::operator<<((ostream *)local_b40,
                                                    "STRINGS option REGEX value \"");
                          pvVar10 = std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::operator[](local_20,(ulong)local_1b0);
                          poVar13 = std::operator<<(poVar13,(string *)pvVar10);
                          std::operator<<(poVar13,"\" could not be compiled.");
                          std::__cxx11::ostringstream::str();
                          cmCommand::SetError(&this->super_cmCommand,&local_b60);
                          std::__cxx11::string::~string((string *)&local_b60);
                          this_local._7_1_ = 0;
                          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b40);
                          goto LAB_005c468c;
                        }
                        bVar4 = true;
                      }
                      else {
                        if (local_1ac != 8) {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_e70);
                          poVar13 = std::operator<<((ostream *)local_e70,
                                                    "STRINGS given unknown argument \"");
                          pvVar10 = std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::operator[](local_20,(ulong)local_1b0);
                          poVar13 = std::operator<<(poVar13,(string *)pvVar10);
                          std::operator<<(poVar13,"\"");
                          std::__cxx11::ostringstream::str();
                          cmCommand::SetError(&this->super_cmCommand,
                                              (string *)((long)&binaryFileName.field_2 + 8));
                          std::__cxx11::string::~string
                                    ((string *)(binaryFileName.field_2._M_local_buf + 8));
                          this_local._7_1_ = 0;
                          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_e70);
                          goto LAB_005c468c;
                        }
                        pvVar10 = std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::operator[](local_20,(ulong)local_1b0);
                        bVar3 = std::operator==(pvVar10,"UTF-8");
                        if (bVar3) {
                          i = 1;
                        }
                        else {
                          pvVar10 = std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::operator[](local_20,(ulong)local_1b0);
                          bVar3 = std::operator==(pvVar10,"UTF-16LE");
                          if (bVar3) {
                            i = 3;
                          }
                          else {
                            pvVar10 = std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::operator[](local_20,(ulong)local_1b0);
                            bVar3 = std::operator==(pvVar10,"UTF-16BE");
                            if (bVar3) {
                              i = 2;
                            }
                            else {
                              pvVar10 = std::
                                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::operator[](local_20,(ulong)local_1b0);
                              bVar3 = std::operator==(pvVar10,"UTF-32LE");
                              if (bVar3) {
                                i = 5;
                              }
                              else {
                                pvVar10 = std::
                                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::operator[](local_20,(ulong)local_1b0);
                                bVar3 = std::operator==(pvVar10,"UTF-32BE");
                                if (!bVar3) {
                                  std::__cxx11::ostringstream::ostringstream
                                            ((ostringstream *)local_cd8);
                                  poVar13 = std::operator<<((ostream *)local_cd8,
                                                            "STRINGS option ENCODING \"");
                                  pvVar10 = std::
                                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ::operator[](local_20,(ulong)local_1b0);
                                  poVar13 = std::operator<<(poVar13,(string *)pvVar10);
                                  std::operator<<(poVar13,"\" not recognized.");
                                  std::__cxx11::ostringstream::str();
                                  cmCommand::SetError(&this->super_cmCommand,&local_cf8);
                                  std::__cxx11::string::~string((string *)&local_cf8);
                                  this_local._7_1_ = 0;
                                  std::__cxx11::ostringstream::~ostringstream
                                            ((ostringstream *)local_cd8);
                                  goto LAB_005c468c;
                                }
                                i = 4;
                              }
                            }
                          }
                        }
                      }
                      local_1ac = 0;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (bVar2) {
    pcVar11 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_eb0,pcVar11,&local_eb1);
    std::allocator<char>::~allocator((allocator<char> *)&local_eb1);
    pcVar11 = cmake::GetCMakeFilesDirectory();
    std::__cxx11::string::operator+=(local_eb0,pcVar11);
    std::__cxx11::string::operator+=(local_eb0,"/FileCommandStringsBinaryFile");
    pcVar11 = (char *)std::__cxx11::string::c_str();
    outFileName = (char *)std::__cxx11::string::c_str();
    bVar2 = cmHexFileConverter::TryConvert(pcVar11,outFileName);
    if (bVar2) {
      std::__cxx11::string::operator=(local_78,local_eb0);
    }
    std::__cxx11::string::~string(local_eb0);
  }
  pcVar11 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_10c0,pcVar11,_S_in);
  bVar5 = std::ios::operator!((ios *)((long)&local_10c0 + *(long *)(local_10c0 + -0x18)));
  if ((bVar5 & 1) == 0) {
    BVar7 = cmsys::FStream::ReadBOM((istream *)&local_10c0);
    if ((i == 0) && (BVar7 != BOM_None)) {
      i = BVar7;
    }
    local_1260 = 0;
    if ((i == 3) || (i == 2)) {
      local_1260 = 1;
    }
    if ((i == 5) || (i == 4)) {
      local_1260 = 3;
    }
    strings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&s.field_2 + 8));
    std::__cxx11::string::string((string *)local_12a0);
    do {
      if (regex.searchstring._4_4_ == 0) {
LAB_005c3b7b:
        if (-1 < (int)limit_count) {
          current_str.field_2._8_8_ = std::istream::tellg();
          sVar14 = std::fpos::operator_cast_to_long((fpos *)(current_str.field_2._M_local_buf + 8));
          local_1455 = false;
          if ((int)limit_count <= (int)sVar14) goto LAB_005c3c18;
        }
        local_1455 = std::ios::operator_cast_to_bool
                               ((ios *)((long)&local_10c0 + *(long *)(local_10c0 + -0x18)));
      }
      else {
        sVar9 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&s.field_2 + 8));
        local_1455 = false;
        if (sVar9 < regex.searchstring._4_4_) goto LAB_005c3b7b;
      }
LAB_005c3c18:
      if (local_1455 == false) break;
      std::__cxx11::string::string((string *)&i_1);
      c1 = std::istream::get();
      for (num_utf8_bytes = 0; num_utf8_bytes < local_1260; num_utf8_bytes = num_utf8_bytes + 1) {
        uVar8 = std::istream::get();
        bVar5 = std::ios::operator!((ios *)((long)&local_10c0 + *(long *)(local_10c0 + -0x18)));
        if ((bVar5 & 1) != 0) {
          std::istream::putback((char)&local_10c0);
          break;
        }
        c1 = c1 << 8 | uVar8;
      }
      if (i == 3) {
        c1 = (c1 & 0xffU) << 8 | (int)(c1 & 0xff00U) >> 8;
      }
      else if (i == 5) {
        c1 = c1 << 0x18 | (c1 & 0xff00U) << 8 | (int)(c1 & 0xff0000U) >> 8 | (uint)c1 >> 0x18;
      }
      if (c1 == 0xd) {
        local_34c = 5;
      }
      else {
        if ((((0x1f < c1) && (c1 < 0x7f)) || (c1 == 9)) || ((c1 == 10 && (bVar1)))) {
          std::__cxx11::string::operator+=((string *)&i_1,(char)c1);
        }
        else if (i == 1) {
          j_1 = 0;
          for (j_2 = 0; j_1 == 0 && j_2 < 3; j_2 = j_2 + 1) {
            if ((c1 & (uint)HandleStringsCommand::utf8_check_table[j_2][0]) ==
                (uint)HandleStringsCommand::utf8_check_table[j_2][1]) {
              j_1 = j_2 + 2;
            }
          }
          for (local_12e8 = 0; local_12e8 < j_1; local_12e8 = local_12e8 + 1) {
            if (local_12e8 != 0) {
              c1 = std::istream::get();
              bVar5 = std::ios::operator!((ios *)((long)&local_10c0 + *(long *)(local_10c0 + -0x18))
                                         );
              if (((bVar5 & 1) != 0) || ((c1 & 0xc0U) != 0x80)) {
                std::istream::putback((char)&local_10c0);
                break;
              }
            }
            std::__cxx11::string::operator+=((string *)&i_1,(char)c1);
          }
          uVar16 = std::__cxx11::string::length();
          if (uVar16 != j_1) {
            for (sep._4_4_ = 0; lVar15 = std::__cxx11::string::size(),
                (ulong)sep._4_4_ < lVar15 - 1U; sep._4_4_ = sep._4_4_ + 1) {
              std::__cxx11::string::size();
              pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)&i_1);
              c1 = (int)*pcVar11;
              std::istream::putback((char)&local_10c0);
            }
            std::__cxx11::string::operator=((string *)&i_1,"");
          }
        }
        if ((c1 != 10) || (bVar1)) {
          uVar16 = std::__cxx11::string::empty();
          if ((uVar16 & 1) == 0) {
            std::__cxx11::string::operator+=((string *)local_12a0,(string *)&i_1);
          }
          else {
            uVar16 = std::__cxx11::string::length();
            if (((uint)limit_input <= uVar16) &&
               (uVar16 = std::__cxx11::string::empty(), (uVar16 & 1) == 0)) {
              if (bVar4) {
                pcVar11 = (char *)std::__cxx11::string::c_str();
                bVar2 = cmsys::RegularExpression::find((RegularExpression *)&encoding,pcVar11);
                if (!bVar2) goto LAB_005c4233;
              }
              iVar6 = std::__cxx11::string::size();
              strings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                   iVar6 + 1 +
                   strings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
              if ((-1 < local_c8) &&
                 (local_c8 <=
                  strings.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)) {
                std::__cxx11::string::operator=((string *)local_12a0,"");
                local_34c = 6;
                goto LAB_005c4369;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&s.field_2 + 8),(value_type *)local_12a0);
            }
LAB_005c4233:
            std::__cxx11::string::operator=((string *)local_12a0,"");
          }
        }
        else {
          uVar16 = std::__cxx11::string::length();
          if ((uint)limit_input <= uVar16) {
            if (bVar4) {
              pcVar11 = (char *)std::__cxx11::string::c_str();
              bVar2 = cmsys::RegularExpression::find((RegularExpression *)&encoding,pcVar11);
              if (!bVar2) goto LAB_005c4130;
            }
            iVar6 = std::__cxx11::string::size();
            strings.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                 iVar6 + 1 +
                 strings.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            if ((-1 < local_c8) &&
               (local_c8 <=
                strings.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)) {
              std::__cxx11::string::operator=((string *)local_12a0,"");
              local_34c = 6;
              goto LAB_005c4369;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&s.field_2 + 8),(value_type *)local_12a0);
          }
LAB_005c4130:
          std::__cxx11::string::operator=((string *)local_12a0,"");
        }
        if ((limit_output != 0) &&
           (uVar16 = std::__cxx11::string::size(), uVar16 == (uint)limit_output)) {
          uVar16 = std::__cxx11::string::length();
          if ((uint)limit_input <= uVar16) {
            if (bVar4) {
              pcVar11 = (char *)std::__cxx11::string::c_str();
              bVar2 = cmsys::RegularExpression::find((RegularExpression *)&encoding,pcVar11);
              if (!bVar2) goto LAB_005c4348;
            }
            iVar6 = std::__cxx11::string::size();
            strings.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                 iVar6 + 1 +
                 strings.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            if ((-1 < local_c8) &&
               (local_c8 <=
                strings.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)) {
              std::__cxx11::string::operator=((string *)local_12a0,"");
              local_34c = 6;
              goto LAB_005c4369;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&s.field_2 + 8),(value_type *)local_12a0);
          }
LAB_005c4348:
          std::__cxx11::string::operator=((string *)local_12a0,"");
        }
        local_34c = 0;
      }
LAB_005c4369:
      std::__cxx11::string::~string((string *)&i_1);
    } while ((local_34c == 0) || (local_34c == 5));
    if (((regex.searchstring._4_4_ == 0) ||
        (sVar9 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&s.field_2 + 8)), sVar9 < regex.searchstring._4_4_)) &&
       ((uVar16 = std::__cxx11::string::empty(), (uVar16 & 1) == 0 &&
        (uVar16 = std::__cxx11::string::length(), (uint)limit_input <= uVar16)))) {
      if (bVar4) {
        pcVar11 = (char *)std::__cxx11::string::c_str();
        bVar2 = cmsys::RegularExpression::find((RegularExpression *)&encoding,pcVar11);
        if (!bVar2) goto LAB_005c4475;
      }
      iVar6 = std::__cxx11::string::size();
      if ((local_c8 < 0) ||
         (iVar6 + 1 +
          strings.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < local_c8)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&s.field_2 + 8),(value_type *)local_12a0);
      }
    }
LAB_005c4475:
    output.field_2._8_8_ = (long)"user=%s\x01auth=Bearer %s\x01\x01" + 0x18;
    std::__cxx11::string::string((string *)&si);
    local_1328._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&s.field_2 + 8));
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_1320,&local_1328);
    while( true ) {
      sr = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&s.field_2 + 8));
      bVar2 = __gnu_cxx::operator!=
                        (&local_1320,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&sr);
      if (!bVar2) break;
      std::__cxx11::string::operator+=((string *)&si,(char *)output.field_2._8_8_);
      output.field_2._8_8_ = (long)"\"$;" + 2;
      pbVar17 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_1320);
      for (local_133c = 0; uVar16 = std::__cxx11::string::size(), local_133c < uVar16;
          local_133c = local_133c + 1) {
        pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)pbVar17);
        if (*pcVar11 == ';') {
          std::__cxx11::string::operator+=((string *)&si,'\\');
        }
        pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)pbVar17);
        std::__cxx11::string::operator+=((string *)&si,*pcVar11);
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_1320);
    }
    this_00 = (this->super_cmCommand).Makefile;
    pcVar11 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(this_00,(string *)&maxlen,pcVar11);
    this_local._7_1_ = 1;
    std::__cxx11::string::~string((string *)&si);
    std::__cxx11::string::~string((string *)local_12a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&s.field_2 + 8));
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1238);
    poVar13 = std::operator<<((ostream *)local_1238,"STRINGS file \"");
    poVar13 = std::operator<<(poVar13,local_78);
    std::operator<<(poVar13,"\" cannot be read.");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,(string *)&bytes_rem);
    std::__cxx11::string::~string((string *)&bytes_rem);
    this_local._7_1_ = 0;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1238);
  }
  std::ifstream::~ifstream(&local_10c0);
LAB_005c468c:
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)&encoding);
  std::__cxx11::string::~string((string *)&maxlen);
  std::__cxx11::string::~string(local_78);
LAB_005c46d2:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFileCommand::HandleStringsCommand(std::vector<std::string> const& args)
{
  if(args.size() < 3)
    {
    this->SetError("STRINGS requires a file name and output variable");
    return false;
    }

  // Get the file to read.
  std::string fileName = args[1];
  if(!cmsys::SystemTools::FileIsFullPath(fileName.c_str()))
    {
    fileName = this->Makefile->GetCurrentSourceDirectory();
    fileName += "/" + args[1];
    }

  // Get the variable in which to store the results.
  std::string outVar = args[2];

  // Parse the options.
  enum { arg_none,
         arg_limit_input,
         arg_limit_output,
         arg_limit_count,
         arg_length_minimum,
         arg_length_maximum,
         arg__maximum,
         arg_regex,
         arg_encoding };
  unsigned int minlen = 0;
  unsigned int maxlen = 0;
  int limit_input = -1;
  int limit_output = -1;
  unsigned int limit_count = 0;
  cmsys::RegularExpression regex;
  bool have_regex = false;
  bool newline_consume = false;
  bool hex_conversion_enabled = true;
  enum { encoding_none = cmsys::FStream::BOM_None,
         encoding_utf8 = cmsys::FStream::BOM_UTF8,
         encoding_utf16le = cmsys::FStream::BOM_UTF16LE,
         encoding_utf16be = cmsys::FStream::BOM_UTF16BE,
         encoding_utf32le = cmsys::FStream::BOM_UTF32LE,
         encoding_utf32be = cmsys::FStream::BOM_UTF32BE};
  int encoding = encoding_none;
  int arg_mode = arg_none;
  for(unsigned int i=3; i < args.size(); ++i)
    {
    if(args[i] == "LIMIT_INPUT")
      {
      arg_mode = arg_limit_input;
      }
    else if(args[i] == "LIMIT_OUTPUT")
      {
      arg_mode = arg_limit_output;
      }
    else if(args[i] == "LIMIT_COUNT")
      {
      arg_mode = arg_limit_count;
      }
    else if(args[i] == "LENGTH_MINIMUM")
      {
      arg_mode = arg_length_minimum;
      }
    else if(args[i] == "LENGTH_MAXIMUM")
      {
      arg_mode = arg_length_maximum;
      }
    else if(args[i] == "REGEX")
      {
      arg_mode = arg_regex;
      }
    else if(args[i] == "NEWLINE_CONSUME")
      {
      newline_consume = true;
      arg_mode = arg_none;
      }
    else if(args[i] == "NO_HEX_CONVERSION")
      {
      hex_conversion_enabled = false;
      arg_mode = arg_none;
      }
    else if(args[i] == "ENCODING")
      {
      arg_mode = arg_encoding;
      }
    else if(arg_mode == arg_limit_input)
      {
      if(sscanf(args[i].c_str(), "%d", &limit_input) != 1 ||
         limit_input < 0)
        {
        std::ostringstream e;
        e << "STRINGS option LIMIT_INPUT value \""
          << args[i] << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
        }
      arg_mode = arg_none;
      }
    else if(arg_mode == arg_limit_output)
      {
      if(sscanf(args[i].c_str(), "%d", &limit_output) != 1 ||
         limit_output < 0)
        {
        std::ostringstream e;
        e << "STRINGS option LIMIT_OUTPUT value \""
          << args[i] << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
        }
      arg_mode = arg_none;
      }
    else if(arg_mode == arg_limit_count)
      {
      int count;
      if(sscanf(args[i].c_str(), "%d", &count) != 1 || count < 0)
        {
        std::ostringstream e;
        e << "STRINGS option LIMIT_COUNT value \""
          << args[i] << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
        }
      limit_count = count;
      arg_mode = arg_none;
      }
    else if(arg_mode == arg_length_minimum)
      {
      int len;
      if(sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0)
        {
        std::ostringstream e;
        e << "STRINGS option LENGTH_MINIMUM value \""
          << args[i] << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
        }
      minlen = len;
      arg_mode = arg_none;
      }
    else if(arg_mode == arg_length_maximum)
      {
      int len;
      if(sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0)
        {
        std::ostringstream e;
        e << "STRINGS option LENGTH_MAXIMUM value \""
          << args[i] << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
        }
      maxlen = len;
      arg_mode = arg_none;
      }
    else if(arg_mode == arg_regex)
      {
      if(!regex.compile(args[i].c_str()))
        {
        std::ostringstream e;
        e << "STRINGS option REGEX value \""
          << args[i] << "\" could not be compiled.";
        this->SetError(e.str());
        return false;
        }
      have_regex = true;
      arg_mode = arg_none;
      }
    else if(arg_mode == arg_encoding)
      {
      if(args[i] == "UTF-8")
        {
        encoding = encoding_utf8;
        }
      else if(args[i] == "UTF-16LE")
        {
        encoding = encoding_utf16le;
        }
      else if(args[i] == "UTF-16BE")
        {
        encoding = encoding_utf16be;
        }
      else if(args[i] == "UTF-32LE")
        {
        encoding = encoding_utf32le;
        }
      else if(args[i] == "UTF-32BE")
        {
        encoding = encoding_utf32be;
        }
      else
        {
        std::ostringstream e;
        e << "STRINGS option ENCODING \""
          << args[i] << "\" not recognized.";
        this->SetError(e.str());
        return false;
        }
      arg_mode = arg_none;
      }
    else
      {
      std::ostringstream e;
      e << "STRINGS given unknown argument \""
        << args[i] << "\"";
      this->SetError(e.str());
      return false;
      }
    }

  if (hex_conversion_enabled)
    {
    // TODO: should work without temp file, but just on a memory buffer
    std::string binaryFileName = this->Makefile->GetCurrentBinaryDirectory();
    binaryFileName += cmake::GetCMakeFilesDirectory();
    binaryFileName += "/FileCommandStringsBinaryFile";
    if(cmHexFileConverter::TryConvert(fileName.c_str(),binaryFileName.c_str()))
      {
      fileName = binaryFileName;
      }
    }

  // Open the specified file.
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(fileName.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(fileName.c_str(), std::ios::in);
#endif
  if(!fin)
    {
    std::ostringstream e;
    e << "STRINGS file \"" << fileName << "\" cannot be read.";
    this->SetError(e.str());
    return false;
    }

  //If BOM is found and encoding was not specified, use the BOM
  int bom_found = cmsys::FStream::ReadBOM(fin);
  if(encoding == encoding_none && bom_found != cmsys::FStream::BOM_None)
    {
    encoding = bom_found;
    }

  unsigned int bytes_rem = 0;
  if(encoding == encoding_utf16le || encoding == encoding_utf16be)
    {
    bytes_rem = 1;
    }
  if(encoding == encoding_utf32le || encoding == encoding_utf32be)
    {
    bytes_rem = 3;
    }

  // Parse strings out of the file.
  int output_size = 0;
  std::vector<std::string> strings;
  std::string s;
  while((!limit_count || strings.size() < limit_count) &&
        (limit_input < 0 || static_cast<int>(fin.tellg()) < limit_input) &&
        fin)
    {
    std::string current_str;

    int c = fin.get();
    for(unsigned int i=0; i<bytes_rem; ++i)
      {
      int c1 = fin.get();
      if(!fin)
        {
        fin.putback(static_cast<char>(c1));
        break;
        }
      c = (c << 8) | c1;
      }
    if(encoding == encoding_utf16le)
      {
      c = ((c & 0xFF) << 8) | ((c & 0xFF00) >> 8);
      }
    else if(encoding == encoding_utf32le)
      {
       c = (((c & 0xFF) << 24) | ((c & 0xFF00) << 8) |
          ((c & 0xFF0000) >> 8) | ((c & 0xFF000000) >> 24));
      }

    if(c == '\r')
      {
      // Ignore CR character to make output always have UNIX newlines.
      continue;
      }

    else if((c >= 0x20 && c < 0x7F) || c == '\t' ||
            (c == '\n' && newline_consume))
      {
      // This is an ASCII character that may be part of a string.
      // Cast added to avoid compiler warning. Cast is ok because
      // c is guaranteed to fit in char by the above if...
      current_str += static_cast<char>(c);
      }
    else if(encoding == encoding_utf8)
      {
      // Check for UTF-8 encoded string (up to 4 octets)
      static const unsigned char utf8_check_table[3][2] =
        {
          {0xE0, 0xC0},
          {0xF0, 0xE0},
          {0xF8, 0xF0},
        };

      // how many octets are there?
      unsigned int num_utf8_bytes = 0;
      for(unsigned int j=0; num_utf8_bytes == 0 && j<3; j++)
        {
        if((c & utf8_check_table[j][0]) == utf8_check_table[j][1])
          num_utf8_bytes = j+2;
        }

      // get subsequent octets and check that they are valid
      for(unsigned int j=0; j<num_utf8_bytes; j++)
        {
        if(j != 0)
          {
          c = fin.get();
          if(!fin || (c & 0xC0) != 0x80)
            {
            fin.putback(static_cast<char>(c));
            break;
            }
          }
        current_str += static_cast<char>(c);
        }

      // if this was an invalid utf8 sequence, discard the data, and put
      // back subsequent characters
      if((current_str.length() != num_utf8_bytes))
        {
        for(unsigned int j=0; j<current_str.size()-1; j++)
          {
          c = current_str[current_str.size() - 1 - j];
          fin.putback(static_cast<char>(c));
          }
        current_str = "";
        }
      }


    if(c == '\n' && !newline_consume)
      {
      // The current line has been terminated.  Check if the current
      // string matches the requirements.  The length may now be as
      // low as zero since blank lines are allowed.
      if(s.length() >= minlen &&
         (!have_regex || regex.find(s.c_str())))
        {
        output_size += static_cast<int>(s.size()) + 1;
        if(limit_output >= 0 && output_size >= limit_output)
          {
          s = "";
          break;
          }
        strings.push_back(s);
        }

      // Reset the string to empty.
      s = "";
      }
    else if(current_str.empty())
      {
      // A non-string character has been found.  Check if the current
      // string matches the requirements.  We require that the length
      // be at least one no matter what the user specified.
      if(s.length() >= minlen && !s.empty() &&
      (!have_regex || regex.find(s.c_str())))
        {
        output_size += static_cast<int>(s.size()) + 1;
        if(limit_output >= 0 && output_size >= limit_output)
          {
          s = "";
          break;
          }
        strings.push_back(s);
        }

      // Reset the string to empty.
      s = "";
      }
    else
      {
      s += current_str;
      }


    if(maxlen > 0 && s.size() == maxlen)
      {
      // Terminate a string if the maximum length is reached.
      if(s.length() >= minlen &&
         (!have_regex || regex.find(s.c_str())))
        {
        output_size += static_cast<int>(s.size()) + 1;
        if(limit_output >= 0 && output_size >= limit_output)
          {
          s = "";
          break;
          }
        strings.push_back(s);
        }
      s = "";
      }
    }

  // If there is a non-empty current string we have hit the end of the
  // input file or the input size limit.  Check if the current string
  // matches the requirements.
  if((!limit_count || strings.size() < limit_count) &&
     !s.empty() && s.length() >= minlen &&
     (!have_regex || regex.find(s.c_str())))
    {
    output_size += static_cast<int>(s.size()) + 1;
    if(limit_output < 0 || output_size < limit_output)
      {
      strings.push_back(s);
      }
    }

  // Encode the result in a CMake list.
  const char* sep = "";
  std::string output;
  for(std::vector<std::string>::const_iterator si = strings.begin();
      si != strings.end(); ++si)
    {
    // Separate the strings in the output to make it a list.
    output += sep;
    sep = ";";

    // Store the string in the output, but escape semicolons to
    // make sure it is a list.
    std::string const& sr = *si;
    for(unsigned int i=0; i < sr.size(); ++i)
      {
      if(sr[i] == ';')
        {
        output += '\\';
        }
      output += sr[i];
      }
    }

  // Save the output in a makefile variable.
  this->Makefile->AddDefinition(outVar, output.c_str());
  return true;
}